

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

realtype N_VWrmsNorm_Serial(N_Vector x,N_Vector w)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  realtype rVar6;
  
  lVar1 = *x->content;
  lVar2 = 0;
  lVar3 = 0;
  if (0 < lVar1) {
    lVar3 = lVar1;
  }
  dVar4 = 0.0;
  for (; lVar3 != lVar2; lVar2 = lVar2 + 1) {
    dVar5 = *(double *)(*(long *)((long)x->content + 0x10) + lVar2 * 8) *
            *(double *)(*(long *)((long)w->content + 0x10) + lVar2 * 8);
    dVar4 = dVar4 + dVar5 * dVar5;
  }
  dVar4 = dVar4 / (double)lVar1;
  rVar6 = 0.0;
  if (0.0 < dVar4) {
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
      return dVar4;
    }
    rVar6 = SQRT(dVar4);
  }
  return rVar6;
}

Assistant:

realtype N_VWrmsNorm_Serial(N_Vector x, N_Vector w)
{
  sunindextype i, N;
  realtype sum, prodi, *xd, *wd;

  sum = ZERO;
  xd = wd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  wd = NV_DATA_S(w);

  for (i = 0; i < N; i++) {
    prodi = xd[i]*wd[i];
    sum += SUNSQR(prodi);
  }

  return(SUNRsqrt(sum/N));
}